

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t archive_read_format_zip_read_data_skip_streamable(archive_read *a)

{
  char cVar1;
  ushort uVar2;
  void *pvVar3;
  char *pcVar4;
  wchar_t wVar5;
  int64_t iVar6;
  long lVar7;
  char *pcVar8;
  int64_t *offset;
  char *pcVar9;
  ssize_t bytes_avail;
  size_t local_30;
  
  pvVar3 = a->format->data;
  iVar6 = __archive_read_consume(a,*(int64_t *)((long)pvVar3 + 0x60));
  *(undefined8 *)((long)pvVar3 + 0x60) = 0;
  if (iVar6 < 0) {
    return L'\xffffffe2';
  }
  if (*(char *)((long)pvVar3 + 0x9a) == '\0') {
    lVar7 = *(long *)((long)pvVar3 + 0x68);
    uVar2 = *(ushort *)(lVar7 + 0x7e);
    offset = (int64_t *)(ulong)uVar2;
    if (((uVar2 & 8) == 0) || (0 < *(long *)(lVar7 + 0x28))) {
      iVar6 = __archive_read_consume(a,*(int64_t *)((long)pvVar3 + 0x70));
      return (uint)(iVar6 >> 0x3f) & 0xffffffe2;
    }
    if (*(char *)((long)pvVar3 + 0x148) != '\0') {
      *(undefined4 *)((long)pvVar3 + 0x30) = 1;
      if ((uVar2 & 0x40) != 0) {
        wVar5 = read_decryption_header(a);
        return wVar5;
      }
      if (*(char *)(lVar7 + 0x80) == 'c') {
        wVar5 = init_WinZip_AES_decryption(a);
      }
      else {
        wVar5 = init_traditional_PKWARE_decryption(a);
      }
      if (wVar5 != L'\0') {
        return wVar5;
      }
      *(undefined1 *)((long)pvVar3 + 0x148) = 0;
      lVar7 = *(long *)((long)pvVar3 + 0x68);
    }
    if (*(char *)(lVar7 + 0x80) != '\b') {
      do {
        pcVar8 = (char *)__archive_read_ahead(a,0x10,&bytes_avail);
        if (bytes_avail < 0x10) {
          archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
          return L'\xffffffe2';
        }
        pcVar4 = pcVar8;
LAB_004b38b7:
        while (pcVar9 = pcVar4, pcVar9 <= pcVar8 + bytes_avail + -0x10) {
          cVar1 = pcVar9[3];
          if (cVar1 != '\a') {
            if (cVar1 != '\b') goto code_r0x004b38cd;
            if (((pcVar9[2] == '\a') && (pcVar9[1] == 'K')) && (*pcVar9 == 'P')) {
              if ((*(byte *)(*(long *)((long)pvVar3 + 0x68) + 0x82) & 1) == 0) {
                lVar7 = 0x10 - (long)pcVar8;
              }
              else {
                lVar7 = 0x18 - (long)pcVar8;
              }
              __archive_read_consume(a,(int64_t)(pcVar9 + lVar7));
              return L'\0';
            }
            goto LAB_004b38f5;
          }
          pcVar4 = pcVar9 + 1;
        }
        __archive_read_consume(a,(long)pcVar9 - (long)pcVar8);
      } while( true );
    }
    while (*(char *)((long)pvVar3 + 0x9a) == '\0') {
      wVar5 = zip_read_data_deflate(a,(void **)&bytes_avail,&local_30,offset);
      if (wVar5 != L'\0') {
        return wVar5;
      }
    }
  }
  return L'\0';
code_r0x004b38cd:
  pcVar4 = pcVar9 + 3;
  if (cVar1 != 'P') {
    if (cVar1 == 'K') {
      pcVar4 = pcVar9 + 2;
    }
    else {
LAB_004b38f5:
      pcVar4 = pcVar9 + 4;
    }
  }
  goto LAB_004b38b7;
}

Assistant:

static int
archive_read_format_zip_read_data_skip_streamable(struct archive_read *a)
{
	struct zip *zip;
	int64_t bytes_skipped;

	zip = (struct zip *)(a->format->data);
	bytes_skipped = __archive_read_consume(a, zip->unconsumed);
	zip->unconsumed = 0;
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	/* If we've already read to end of data, we're done. */
	if (zip->end_of_entry)
		return (ARCHIVE_OK);

	/* So we know we're streaming... */
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    || zip->entry->compressed_size > 0) {
		/* We know the compressed length, so we can just skip. */
		bytes_skipped = __archive_read_consume(a,
					zip->entry_bytes_remaining);
		if (bytes_skipped < 0)
			return (ARCHIVE_FATAL);
		return (ARCHIVE_OK);
	}

	if (zip->init_decryption) {
		int r;

		zip->has_encrypted_entries = 1;
		if (zip->entry->zip_flags & ZIP_STRONG_ENCRYPTED)
			r = read_decryption_header(a);
		else if (zip->entry->compression == WINZIP_AES_ENCRYPTION)
			r = init_WinZip_AES_decryption(a);
		else
			r = init_traditional_PKWARE_decryption(a);
		if (r != ARCHIVE_OK)
			return (r);
		zip->init_decryption = 0;
	}

	/* We're streaming and we don't know the length. */
	/* If the body is compressed and we know the format, we can
	 * find an exact end-of-entry by decompressing it. */
	switch (zip->entry->compression) {
#ifdef HAVE_ZLIB_H
	case 8: /* Deflate compression. */
		while (!zip->end_of_entry) {
			int64_t offset = 0;
			const void *buff = NULL;
			size_t size = 0;
			int r;
			r =  zip_read_data_deflate(a, &buff, &size, &offset);
			if (r != ARCHIVE_OK)
				return (r);
		}
		return ARCHIVE_OK;
#endif
	default: /* Uncompressed or unknown. */
		/* Scan for a PK\007\010 signature. */
		for (;;) {
			const char *p, *buff;
			ssize_t bytes_avail;
			buff = __archive_read_ahead(a, 16, &bytes_avail);
			if (bytes_avail < 16) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated ZIP file data");
				return (ARCHIVE_FATAL);
			}
			p = buff;
			while (p <= buff + bytes_avail - 16) {
				if (p[3] == 'P') { p += 3; }
				else if (p[3] == 'K') { p += 2; }
				else if (p[3] == '\007') { p += 1; }
				else if (p[3] == '\010' && p[2] == '\007'
				    && p[1] == 'K' && p[0] == 'P') {
					if (zip->entry->flags & LA_USED_ZIP64)
						__archive_read_consume(a,
						    p - buff + 24);
					else
						__archive_read_consume(a,
						    p - buff + 16);
					return ARCHIVE_OK;
				} else { p += 4; }
			}
			__archive_read_consume(a, p - buff);
		}
	}
}